

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::BuiltinFunction::BuiltinFunction
          (BuiltinFunction *this,LocationRange *lr,string *name,Identifiers *params)

{
  pointer pcVar1;
  Fodder local_48;
  
  local_48.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AST::AST(&this->super_AST,lr,AST_BUILTIN_FUNCTION,&local_48);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_48);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__BuiltinFunction_002a03d0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector(&this->params,params);
  return;
}

Assistant:

BuiltinFunction(const LocationRange &lr, const std::string &name, const Identifiers &params)
        : AST(lr, AST_BUILTIN_FUNCTION, Fodder{}), name(name), params(params)
    {
    }